

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

uint ncnn::get_elf_hwcap_from_proc_self_auxv(void)

{
  int iVar1;
  size_t sVar2;
  int nread;
  uint result;
  anon_struct_8_2_05f151bc entry;
  FILE *fp;
  uint local_1c;
  int local_18;
  uint local_14;
  FILE *local_10;
  uint local_4;
  
  local_10 = fopen("/proc/self/auxv","rb");
  if (local_10 == (FILE *)0x0) {
    fprintf(_stderr,"fopen /proc/self/auxv failed");
    fprintf(_stderr,"\n");
    local_4 = 0;
  }
  else {
    local_1c = 0;
    do {
      iVar1 = feof(local_10);
      if (((iVar1 != 0) || (sVar2 = fread(&local_18,8,1,local_10), (int)sVar2 != 1)) ||
         ((local_18 == 0 && (local_14 == 0)))) goto LAB_00955be9;
    } while (local_18 != 0x10);
    local_1c = local_14;
LAB_00955be9:
    fclose(local_10);
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

static unsigned int get_elf_hwcap_from_proc_self_auxv()
{
    FILE* fp = fopen("/proc/self/auxv", "rb");
    if (!fp)
    {
        NCNN_LOGE("fopen /proc/self/auxv failed");
        return 0;
    }

#if __aarch64__ || __riscv_xlen == 64
    struct
    {
        uint64_t tag;
        uint64_t value;
    } entry;
#else
    struct
    {
        unsigned int tag;
        unsigned int value;
    } entry;

#endif

    unsigned int result = 0;
    while (!feof(fp))
    {
        int nread = fread((char*)&entry, sizeof(entry), 1, fp);
        if (nread != 1)
            break;

        if (entry.tag == 0 && entry.value == 0)
            break;

        if (entry.tag == AT_HWCAP)
        {
            result = entry.value;
            break;
        }
    }

    fclose(fp);

    return result;
}